

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

TablePrinter * Catch::operator<<(TablePrinter *tp,Duration *value)

{
  ostream *poVar1;
  char *__s;
  double dVar2;
  allocator<char> local_39;
  string local_38 [32];
  
  dVar2 = value->m_inNanoseconds;
  switch(value->m_units) {
  case Microseconds:
    dVar2 = dVar2 / 1000.0;
    break;
  case Milliseconds:
    dVar2 = dVar2 / 1000000.0;
    break;
  case Seconds:
    dVar2 = dVar2 / 1000000000.0;
    break;
  case Minutes:
    dVar2 = dVar2 / 60000000000.0;
  }
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  poVar1 = std::operator<<(poVar1,' ');
  switch(value->m_units) {
  case Nanoseconds:
    __s = "ns";
    break;
  case Microseconds:
    __s = "us";
    break;
  case Milliseconds:
    __s = "ms";
    break;
  case Seconds:
    __s = "s";
    break;
  case Minutes:
    __s = "m";
    break;
  default:
    __s = "** internal error **";
  }
  std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
  std::operator<<(poVar1,local_38);
  std::__cxx11::string::~string(local_38);
  return tp;
}

Assistant:

TablePrinter& operator << (TablePrinter& tp, T const& value) {
        tp.m_oss << value;
        return tp;
    }